

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

int vt_fix_cb(void *sysdata,void *userdata)

{
  ushort uVar1;
  short *psVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  prf_state_t *state;
  ulong uVar7;
  
  psVar2 = *(short **)((long)sysdata + 8);
  iVar5 = 2;
  if ((*(byte *)(psVar2 + 2) & 1) == 0) {
    iVar5 = 1;
    if ((*psVar2 == 0x59) || (*psVar2 == 0x48)) {
      uVar1 = psVar2[1];
      if (7 < uVar1) {
        lVar3 = *(long *)(psVar2 + 4);
        iVar6 = uVar1 - 1;
        if (-1 < (int)(uVar1 - 4)) {
          iVar6 = uVar1 - 4;
        }
        iVar5 = 1;
        uVar4 = iVar6 >> 2;
        if (iVar6 >> 2 < 2) {
          uVar4 = 1;
        }
        uVar7 = 0;
        do {
          *(undefined4 *)(lVar3 + uVar7 * 4) =
               *(undefined4 *)((long)userdata + (ulong)*(uint *)(lVar3 + uVar7 * 4));
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
    }
  }
  return iVar5;
}

Assistant:

static
int
vt_fix_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state = (prf_state_t *) sysdata;
    uint8_t * rlt = (uint8_t *) userdata;
    prf_node_t * node = state->node;

    if ( node->flags & PRF_NODE_DELETED )
        return PRF_TRAV_SIBLING;

    switch ( node->opcode ) {
    case 72: /* vertex list */
    case 89: /* morph vertex list */
        do {
            int i, num;
            uint32_t * data;
            data = (uint32_t *) node->data;
            num = (node->length - 4) / 4;
            for ( i = 0; i < num; i++ )
                data[i] = ((uint32_t *)(rlt + data[i]))[0];
        } while ( FALSE );
        break;
    default:
        break;
    }
    return PRF_TRAV_CONTINUE;
}